

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_ttf_font_info *
rf_parse_ttf_font(rf_ttf_font_info *__return_storage_ptr__,void *ttf_data,rf_int font_size)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  int iVar10;
  ushort uVar11;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *tag_06;
  undefined8 extraout_RDX;
  char *tag_07;
  stbtt_uint32 encoding_record;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  stbtt__buf sVar18;
  stbtt__buf sVar19;
  uint local_f4;
  stbtt_uint32 local_e8;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  undefined8 local_d8;
  uchar *local_d0;
  undefined8 local_c8;
  uchar *local_c0;
  undefined8 local_b8;
  uchar *local_b0;
  stbtt_uint32 local_a8;
  stbtt_uint32 local_a4;
  stbtt_uint32 local_a0;
  stbtt_uint32 local_9c;
  undefined8 local_98;
  uchar *local_90;
  undefined8 local_88;
  uchar *local_80;
  undefined8 local_78;
  rf_int local_70;
  stbtt__buf local_68;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  stbtt__buf local_40;
  
  memset(__return_storage_ptr__,0,200);
  if (font_size < 1 || ttf_data == (void *)0x0) {
    return __return_storage_ptr__;
  }
  local_70 = font_size;
  sVar4 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x173cf6,tag);
  sVar5 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fa6,tag_00);
  sVar6 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fab,tag_01);
  sVar7 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fb0,tag_02);
  sVar8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fb5,tag_03);
  sVar9 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fba,tag_04);
  local_a4 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fbf,tag_05);
  local_a8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fc4,tag_06);
  tag_07 = (char *)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                            (sVar9 == 0 || sVar8 == 0) || (sVar6 == 0 || sVar4 == 0));
  local_a0 = sVar9;
  local_9c = sVar8;
  if ((sVar9 == 0 || sVar8 == 0) || (sVar6 == 0 || sVar4 == 0)) goto LAB_00130171;
  if (sVar7 == 0) {
    charstrings = 0;
    fdarrayoff = 0;
    cstype = 2;
    local_e8 = 0;
    sVar8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fc9,tag_07);
    if (sVar8 == 0) goto LAB_00130171;
    local_90 = (uchar *)((long)ttf_data + (ulong)sVar8);
    local_78 = 0x2000000000000000;
    local_68.size = 0x20000000;
    local_68.cursor = (int)*(byte *)((long)ttf_data + (ulong)sVar8 + 2);
    local_68.data = local_90;
    stbtt__cff_get_index(&local_68);
    sVar18 = stbtt__cff_get_index(&local_68);
    local_40 = stbtt__cff_index_get(sVar18,0);
    stbtt__cff_get_index(&local_68);
    sVar18 = stbtt__cff_get_index(&local_68);
    local_88 = sVar18._8_8_;
    local_80 = sVar18.data;
    stbtt__dict_get_ints(&local_40,0x11,1,&charstrings);
    stbtt__dict_get_ints(&local_40,0x106,1,&cstype);
    stbtt__dict_get_ints(&local_40,0x124,1,&fdarrayoff);
    stbtt__dict_get_ints(&local_40,0x125,1,&local_e8);
    uVar12 = local_68.size;
    sVar18.cursor = local_68.cursor;
    sVar18.data = local_68.data;
    sVar18.size = local_68.size;
    sVar19 = stbtt__get_subrs(sVar18,local_40);
    sVar9 = charstrings;
    sVar8 = local_e8;
    if (charstrings == 0 || cstype != 2) goto LAB_00130171;
    if (fdarrayoff == 0) {
      local_c0 = (uchar *)0x0;
      local_c8 = 0;
      sVar18 = (stbtt__buf)ZEXT816(0);
    }
    else {
      if (local_e8 == 0) goto LAB_00130171;
      local_68.cursor = fdarrayoff;
      if ((int)uVar12 < (int)fdarrayoff) {
        local_68.cursor = uVar12;
      }
      if ((int)fdarrayoff < 0) {
        local_68.cursor = uVar12;
      }
      local_b8 = sVar19._8_8_;
      local_b0 = sVar19.data;
      sVar18 = stbtt__cff_get_index(&local_68);
      uVar12 = local_68.size;
      local_c8 = sVar18._8_8_;
      local_c0 = sVar18.data;
      sVar18 = stbtt__buf_range(&local_68,sVar8,local_68.size - sVar8);
      sVar19.cursor = (undefined4)local_b8;
      sVar19.size = local_b8._4_4_;
      sVar19.data = local_b0;
    }
    local_d8 = sVar18._8_8_;
    local_d0 = sVar18.data;
    local_b8 = sVar19._8_8_;
    local_b0 = sVar19.data;
    local_68.cursor = sVar9;
    if ((int)uVar12 < (int)sVar9) {
      local_68.cursor = uVar12;
    }
    if ((int)sVar9 < 0) {
      local_68.cursor = uVar12;
    }
    sVar18 = stbtt__cff_get_index(&local_68);
    local_98 = sVar18._8_8_;
  }
  else {
    local_90 = (uchar *)0x0;
    local_78 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = tag_07;
    sVar18 = (stbtt__buf)(auVar3 << 0x40);
    local_98 = 0;
    local_80 = (uchar *)0x0;
    local_88 = 0;
    local_b0 = (uchar *)0x0;
    local_b8 = 0;
    local_c0 = (uchar *)0x0;
    local_c8 = 0;
    local_d0 = (uchar *)0x0;
    local_d8 = 0;
    if (sVar5 == 0) goto LAB_00130171;
  }
  sVar8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x174fce,sVar18._8_8_);
  if (sVar8 == 0) {
    local_f4 = 0xffff;
  }
  else {
    uVar11 = *(ushort *)((long)ttf_data + (ulong)sVar8 + 4);
    local_f4 = (uint)(ushort)(uVar11 << 8 | uVar11 >> 8);
  }
  uVar11 = *(ushort *)((long)ttf_data + (ulong)sVar4 + 2);
  uVar16 = (ulong)(ushort)(uVar11 << 8 | uVar11 >> 8);
  uVar12 = sVar4 + 4;
  iVar10 = 0;
  while( true ) {
    uVar13 = (ulong)uVar12;
    bVar17 = uVar16 == 0;
    uVar16 = uVar16 - 1;
    if (bVar17) break;
    uVar11 = *(ushort *)((long)ttf_data + uVar13) << 8 | *(ushort *)((long)ttf_data + uVar13) >> 8;
    if ((uVar11 == 0) ||
       ((uVar11 == 3 &&
        ((uVar11 = *(ushort *)((long)ttf_data + uVar13 + 2), uVar11 = uVar11 << 8 | uVar11 >> 8,
         uVar11 == 10 || (uVar11 == 1)))))) {
      sVar8 = ttULONG((stbtt_uint8 *)((long)ttf_data + uVar13 + 4));
      iVar10 = sVar8 + sVar4;
    }
    uVar12 = uVar12 + 8;
  }
  if (iVar10 != 0) {
    lVar15 = (long)(int)local_9c;
    uVar12 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar15 + 4) << 8) |
             (uint)*(byte *)((long)ttf_data + lVar15 + 5);
    uVar14 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar15 + 6) << 8) |
             (uint)*(byte *)((long)ttf_data + lVar15 + 7);
    uVar11 = *(ushort *)((long)ttf_data + (long)(int)sVar6 + 0x32);
    bVar1 = *(byte *)((long)ttf_data + lVar15 + 8);
    bVar2 = *(byte *)((long)ttf_data + lVar15 + 9);
    *(undefined4 *)&__return_storage_ptr__->field_0xc4 = 0;
    *(undefined4 *)&__return_storage_ptr__->field_0xc1 = 0;
    __return_storage_ptr__->ttf_data = ttf_data;
    __return_storage_ptr__->font_size = (int)local_70;
    __return_storage_ptr__->largest_glyph_size = 0;
    __return_storage_ptr__->scale_factor = (float)local_70 / (float)(int)(uVar12 - uVar14);
    __return_storage_ptr__->ascent = uVar12;
    __return_storage_ptr__->descent = uVar14;
    __return_storage_ptr__->line_gap = (int)(short)((ushort)bVar1 << 8) | (uint)bVar2;
    __return_storage_ptr__->valid = true;
    (__return_storage_ptr__->internal_stb_font_info).userdata = (void *)0x0;
    (__return_storage_ptr__->internal_stb_font_info).data = (uchar *)ttf_data;
    (__return_storage_ptr__->internal_stb_font_info).fontstart = 0;
    (__return_storage_ptr__->internal_stb_font_info).numGlyphs = local_f4;
    (__return_storage_ptr__->internal_stb_font_info).loca = sVar5;
    (__return_storage_ptr__->internal_stb_font_info).head = sVar6;
    (__return_storage_ptr__->internal_stb_font_info).glyf = sVar7;
    (__return_storage_ptr__->internal_stb_font_info).hhea = local_9c;
    (__return_storage_ptr__->internal_stb_font_info).hmtx = local_a0;
    (__return_storage_ptr__->internal_stb_font_info).kern = local_a4;
    (__return_storage_ptr__->internal_stb_font_info).gpos = local_a8;
    (__return_storage_ptr__->internal_stb_font_info).svg = -1;
    (__return_storage_ptr__->internal_stb_font_info).index_map = iVar10;
    (__return_storage_ptr__->internal_stb_font_info).indexToLocFormat =
         (uint)(ushort)(uVar11 << 8 | uVar11 >> 8);
    (__return_storage_ptr__->internal_stb_font_info).cff.data = local_90;
    (__return_storage_ptr__->internal_stb_font_info).cff.cursor = (undefined4)local_78;
    (__return_storage_ptr__->internal_stb_font_info).cff.size = local_78._4_4_;
    (__return_storage_ptr__->internal_stb_font_info).charstrings.data = sVar18.data;
    (__return_storage_ptr__->internal_stb_font_info).charstrings.cursor = (undefined4)local_98;
    (__return_storage_ptr__->internal_stb_font_info).charstrings.size = local_98._4_4_;
    (__return_storage_ptr__->internal_stb_font_info).gsubrs.data = local_80;
    (__return_storage_ptr__->internal_stb_font_info).gsubrs.cursor = (undefined4)local_88;
    (__return_storage_ptr__->internal_stb_font_info).gsubrs.size = local_88._4_4_;
    (__return_storage_ptr__->internal_stb_font_info).subrs.data = local_b0;
    (__return_storage_ptr__->internal_stb_font_info).subrs.cursor = (undefined4)local_b8;
    (__return_storage_ptr__->internal_stb_font_info).subrs.size = local_b8._4_4_;
    (__return_storage_ptr__->internal_stb_font_info).fontdicts.data = local_c0;
    (__return_storage_ptr__->internal_stb_font_info).fontdicts.cursor = (undefined4)local_c8;
    (__return_storage_ptr__->internal_stb_font_info).fontdicts.size = local_c8._4_4_;
    (__return_storage_ptr__->internal_stb_font_info).fdselect.data = local_d0;
    (__return_storage_ptr__->internal_stb_font_info).fdselect.cursor = (undefined4)local_d8;
    (__return_storage_ptr__->internal_stb_font_info).fdselect.size = local_d8._4_4_;
    return __return_storage_ptr__;
  }
LAB_00130171:
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_50 = "rf_parse_ttf_font";
  local_48 = 0x5b6e;
  rf_log_impl(8,0x1736ef,(char *)0x8);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_parse_ttf_font";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x5b6e;
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 8;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ttf_font_info rf_parse_ttf_font(const void* ttf_data, rf_int font_size)
{
    rf_ttf_font_info result = {0};

    if (ttf_data && font_size > 0)
    {
        stbtt_fontinfo font_info = {0};
        if (stbtt_InitFont(&font_info, ttf_data, 0))
        {
            // Calculate font scale factor
            float scale_factor = stbtt_ScaleForPixelHeight(&font_info, (float)font_size);

            // Calculate font basic metrics
            // NOTE: ascent is equivalent to font baseline
            int ascent, descent, line_gap;
            stbtt_GetFontVMetrics(&font_info, &ascent, &descent, &line_gap);

            result = (rf_ttf_font_info)
            {
                .ttf_data = ttf_data,
                .font_size = font_size,
                .scale_factor = scale_factor,
                .ascent = ascent,
                .descent = descent,
                .line_gap = line_gap,
                .valid = true,
            };

            RF_ASSERT(sizeof(stbtt_fontinfo) == sizeof(result.internal_stb_font_info));
            memcpy(&result.internal_stb_font_info, &font_info, sizeof(stbtt_fontinfo));
        }
        else RF_LOG_ERROR(RF_STBTT_FAILED, "STB failed to parse ttf font.");
    }

    return result;
}